

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,StringPiece *value)

{
  string local_30;
  
  StringPiece::ToString_abi_cxx11_(&local_30,value);
  std::__cxx11::string::append((string *)&this->message_);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const StringPiece& value) {
  message_ += value.ToString();
  return *this;
}